

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

AssertionResult *
iutest::internal::EqFailure
          (AssertionResult *__return_storage_ptr__,char *expected_expression,char *actual_expression
          ,string *expected,string *actual,bool ignoring_case)

{
  bool bVar1;
  ostream *poVar2;
  AssertionResult *rhs;
  iu_global_format_stringstream strm;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  AssertionResult local_1e0;
  undefined1 local_1b8 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  poVar2 = std::operator<<((ostream *)(local_1b8 + 0x10),"error: Value of ");
  poVar2 = std::operator<<(poVar2,actual_expression);
  poVar2 = std::operator<<(poVar2,"\n  Actual: ");
  poVar2 = std::operator<<(poVar2,(string *)actual);
  poVar2 = std::operator<<(poVar2,"\nExpected: ");
  std::operator<<(poVar2,expected_expression);
  if (ignoring_case) {
    std::operator<<((ostream *)(local_1b8 + 0x10)," (ignoring case)");
  }
  bVar1 = detail::IsStringEqual(expected_expression,(expected->_M_dataplus)._M_p);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)(local_1b8 + 0x10),"\nWhich is: ");
    std::operator<<(poVar2,(string *)expected);
  }
  local_1e0.m_message._M_dataplus._M_p = (pointer)&local_1e0.m_message.field_2;
  local_1e0.m_message._M_string_length = 0;
  local_1e0.m_message.field_2._M_local_buf[0] = '\0';
  local_1e0.m_result = false;
  std::__cxx11::stringbuf::str();
  rhs = AssertionResult::operator<<(&local_1e0,&local_200);
  AssertionResult::AssertionResult(__return_storage_ptr__,rhs);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1b8);
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult EqFailure(const char* expected_expression, const char* actual_expression
    , const ::std::string& expected, const ::std::string& actual, bool ignoring_case = false)
{
    iu_global_format_stringstream strm;
    strm << "error: Value of " << actual_expression
        << "\n  Actual: " << actual
        << "\nExpected: " << expected_expression;
    if( ignoring_case )
    {
        strm << " (ignoring case)";
    }
    if( !detail::IsStringEqual(expected_expression, expected.c_str()) )
    {
        strm << "\nWhich is: " << expected;
    }
    return AssertionFailure() << strm.str();
}